

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

void evmap_signal_active_(event_base *base,int sig,int ncalls)

{
  long *plVar1;
  event *ev;
  
  if ((((-1 < sig) && (sig < (base->sigmap).nentries)) &&
      (plVar1 = (long *)(base->sigmap).entries[(uint)sig], plVar1 != (long *)0x0)) &&
     (ev = (event *)*plVar1, ev != (event *)0x0)) {
    do {
      event_active_nolock_(ev,8,(short)ncalls);
      ev = (ev->ev_).ev_io.ev_io_next.le_next;
    } while (ev != (event *)0x0);
  }
  return;
}

Assistant:

void
evmap_signal_active_(struct event_base *base, evutil_socket_t sig, int ncalls)
{
	struct event_signal_map *map = &base->sigmap;
	struct evmap_signal *ctx;
	struct event *ev;

	if (sig < 0 || sig >= map->nentries)
		return;
	GET_SIGNAL_SLOT(ctx, map, sig, evmap_signal);

	if (!ctx)
		return;
	LIST_FOREACH(ev, &ctx->events, ev_signal_next)
		event_active_nolock_(ev, EV_SIGNAL, ncalls);
}